

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

int amqp_messenger_set_option(AMQP_MESSENGER_HANDLE messenger_handle,char *name,void *value)

{
  int iVar1;
  MAP_RESULT MVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_MESSENGER_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  int result;
  void *value_local;
  char *name_local;
  AMQP_MESSENGER_HANDLE messenger_handle_local;
  
  if (((messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) || (name == (char *)0x0)) ||
     (value == (void *)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_set_option",0x5db,1,
                "Invalid argument (messenger_handle=%p, name=%p, value=%p)",messenger_handle,name,
                value);
    }
    l._4_4_ = 0x5dc;
  }
  else {
    iVar1 = strcmp("amqp_event_send_timeout_secs",name);
    if (iVar1 == 0) {
      iVar1 = message_queue_set_max_message_enqueued_time_secs(messenger_handle->send_queue,*value);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"amqp_messenger_set_option",0x5e6,1,"Failed setting option %s",
                    "amqp_event_send_timeout_secs");
        }
        l._4_4_ = 0x5e7;
      }
    }
    else {
      iVar1 = strcmp(OPTION_PRODUCT_INFO,name);
      if (iVar1 == 0) {
        MVar2 = Map_AddOrUpdate((messenger_handle->config->send_link).attach_properties,
                                "com.microsoft:client-version",(char *)value);
        if (MVar2 == MAP_OK) {
          MVar2 = Map_AddOrUpdate((messenger_handle->config->receive_link).attach_properties,
                                  "com.microsoft:client-version",(char *)value);
          if (MVar2 == MAP_OK) {
            l._4_4_ = 0;
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                        ,"amqp_messenger_set_option",0x5f8,1,
                        "Failed setting option %s for receive link","com.microsoft:client-version");
            }
            l._4_4_ = 0x5f9;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"amqp_messenger_set_option",0x5fe,1,"Failed setting option %s for send link",
                      "com.microsoft:client-version");
          }
          l._4_4_ = 0x5ff;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"amqp_messenger_set_option",0x604,1,
                    "Invalid argument (option \'%s\' is not valid)",name);
        }
        l._4_4_ = 0x605;
      }
    }
  }
  return l._4_4_;
}

Assistant:

int amqp_messenger_set_option(AMQP_MESSENGER_HANDLE messenger_handle, const char* name, void* value)
{
    int result;

    if (messenger_handle == NULL || name == NULL || value == NULL)
    {
        LogError("Invalid argument (messenger_handle=%p, name=%p, value=%p)",
            messenger_handle, name, value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        if (strcmp(AMQP_MESSENGER_OPTION_EVENT_SEND_TIMEOUT_SECS, name) == 0)
        {
            if (message_queue_set_max_message_enqueued_time_secs(instance->send_queue, *(size_t*)value) != 0)
            {
                LogError("Failed setting option %s", AMQP_MESSENGER_OPTION_EVENT_SEND_TIMEOUT_SECS);
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
        else if(strcmp(OPTION_PRODUCT_INFO, name) == 0)
        {
            if (Map_AddOrUpdate(instance->config->send_link.attach_properties, CLIENT_VERSION_PROPERTY_NAME, value) == MAP_OK)
            {
                if (Map_AddOrUpdate(instance->config->receive_link.attach_properties, CLIENT_VERSION_PROPERTY_NAME, value) == MAP_OK)
                {
                    result = RESULT_OK;
                }
                else
                {
                    LogError("Failed setting option %s for receive link", CLIENT_VERSION_PROPERTY_NAME);
                    result = MU_FAILURE;
                }
            }
            else
            {
                LogError("Failed setting option %s for send link", CLIENT_VERSION_PROPERTY_NAME);
                result = MU_FAILURE;
            }
        }
        else
        {
            LogError("Invalid argument (option '%s' is not valid)", name);
            result = MU_FAILURE;
        }
    }

    return result;
}